

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::GreaterThanEqualTest<unsigned_short,long_long>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_1a;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_16;
  int local_14 [3];
  
  local_14[2] = 3;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(&local_16,local_14 + 2);
  if (local_16.m_int < 3) {
    local_14[1] = 4;
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt<int>(&local_18,local_14 + 1);
    if (4 < local_18.m_int) {
      local_14[0] = 6;
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>(&local_1a,local_14);
      return 6 < local_1a.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanEqualTest()
	{
		return
			(U)2 >= SafeInt<T>(3) &&
			SafeInt<T>(4) >= (U)5 &&
			SafeInt<T>(6) >= SafeInt<U>(7);
	}